

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

bool __thiscall
kj::_::PromiseAwaiterBase::awaitSuspendImpl(PromiseAwaiterBase *this,CoroutineBase *coroutine)

{
  bool bVar1;
  PromiseNode *pPVar2;
  Event *local_28;
  CoroutineBase *coroutine_local;
  PromiseAwaiterBase *this_local;
  
  pPVar2 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->node);
  (*(pPVar2->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])(pPVar2,&this->node);
  pPVar2 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->node);
  local_28 = (Event *)0x0;
  if (coroutine != (CoroutineBase *)0x0) {
    local_28 = &coroutine->super_Event;
  }
  (*(pPVar2->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar2,local_28);
  bVar1 = CoroutineBase::canImmediatelyResume(coroutine);
  if (bVar1) {
    Event::disarm(&coroutine->super_Event);
  }
  else {
    CoroutineBase::setPromiseNodeForTrace(coroutine,&this->node);
    Maybe<kj::_::CoroutineBase_&>::operator=(&this->maybeCoroutine,coroutine);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool PromiseAwaiterBase::awaitSuspendImpl(CoroutineBase& coroutine) {
  node->setSelfPointer(&node);
  node->onReady(&coroutine);

  if (coroutine.canImmediatelyResume()) {
    // The result is immediately ready and this coroutine is running on the event loop's stack, not
    // a user code stack. Let's cancel our event and immediately resume. It's important that we
    // don't perform this optimization if this is the first suspension, because our caller may
    // depend on running code before this promise's continuations fire.
    coroutine.disarm();

    // We can resume ourselves by returning false. This accomplishes the same thing as if we had
    // returned true from await_ready().
    return false;
  } else {
    // Otherwise, we must suspend. Store a reference to the OwnPromiseNode we're waiting on for
    // tracing purposes; await_resume() and/or ~PromiseAwaiterBase() will clear it using the
    // CoroutineBase& reference we save.
    coroutine.setPromiseNodeForTrace(node);
    maybeCoroutine = coroutine;

    return true;
  }
}